

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

treeNode * Executor::idExp(treeNode *node)

{
  AttrKind AVar1;
  treeNode *ptVar2;
  float fVar3;
  Var *pVVar4;
  treeNode *ptVar5;
  string *this;
  string name;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  ptVar5 = node->child[0];
  std::__cxx11::string::string((string *)&name,(string *)&node->child[1]->text);
  ptVar2 = node->child[2];
  std::__cxx11::string::string((string *)&local_38,(string *)&name);
  pVVar4 = getVar(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (ptVar5 == (treeNode *)0x0) {
    if (ptVar2 != (treeNode *)0x0) {
      ptVar5 = (treeNode *)operator_new(0x58);
      std::__cxx11::string::string((string *)&local_78,(string *)&name);
      treeNode::treeNode(ptVar5,idExp,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (pVVar4->kind == Decmical) {
        (pVVar4->value).decmical = (pVVar4->value).decmical + 1.0;
      }
      else {
        if (pVVar4->kind != Integer) {
          reportError(name._M_dataplus._M_p._4_4_);
        }
        (pVVar4->value).integer = (pVVar4->value).integer + 1;
      }
      goto LAB_0010b1b2;
    }
    AVar1 = pVVar4->kind;
    if (AVar1 == Boolean) {
      ptVar5 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar5,(pVVar4->value).boolean);
      goto LAB_0010b1b2;
    }
    if (AVar1 == Decmical) {
      ptVar5 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar5,(pVVar4->value).decmical);
      goto LAB_0010b1b2;
    }
    if (AVar1 == Integer) {
      ptVar5 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar5,(pVVar4->value).integer);
      goto LAB_0010b1b2;
    }
    ptVar5 = (treeNode *)operator_new(0x58);
    std::__cxx11::string::string((string *)&local_98,(string *)&pVVar4->text);
    treeNode::treeNode(ptVar5,&local_98);
    this = &local_98;
  }
  else {
    if (pVVar4->kind == Decmical) {
      fVar3 = (pVVar4->value).decmical + 1.0;
    }
    else {
      if (pVVar4->kind != Integer) {
        reportError(name._M_dataplus._M_p._4_4_);
      }
      fVar3 = (float)((pVVar4->value).integer + 1);
    }
    (pVVar4->value).integer = (int)fVar3;
    ptVar5 = (treeNode *)operator_new(0x58);
    std::__cxx11::string::string((string *)&local_58,(string *)&name);
    treeNode::treeNode(ptVar5,idExp,&local_58);
    this = &local_58;
  }
  std::__cxx11::string::~string((string *)this);
LAB_0010b1b2:
  std::__cxx11::string::~string((string *)&name);
  return ptVar5;
}

Assistant:

treeNode* idExp(treeNode* node)
    {
        auto left = node->child[0];
        auto name = node->child[1]->text;
        auto right = node->child[2];
        auto var = getVar(name);
        if(left!=nullptr)
        {
            if(var->kind==AttrKind::Integer)
            {
                var->value.integer++;
            }
            else if(var->kind==AttrKind::Decmical)
            {
                var->value.decmical++;
            }
            else reportError(Error::errorType);
            return new treeNode(ExpKind::idExp,name);
        }
        if(right!=nullptr)
        {
            auto tmp = new treeNode(ExpKind::idExp,name);
            if(var->kind==AttrKind::Integer)
            {
                var->value.integer++;
            }
            else if(var->kind==AttrKind::Decmical)
            {
                var->value.decmical++;
            }
            else reportError(Error::errorType);
            return tmp;
        }

        if(var->kind==AttrKind::Integer)       return new treeNode(var->value.integer);
        else if(var->kind==AttrKind::Decmical) return new treeNode(var->value.decmical);
        else if(var->kind==AttrKind::Boolean)  return new treeNode(var->value.boolean);
        else if(var->kind==AttrKind::Text)     return new treeNode(var->text);
    }